

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O1

void __thiscall
intel_keym_v1_t::signature_t::signature_t
          (signature_t *this,kstream *p__io,key_signature_t *p__parent,intel_keym_v1_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__signature_t_00185948;
  (this->m_signature)._M_dataplus._M_p = (pointer)&(this->m_signature).field_2;
  (this->m_signature)._M_string_length = 0;
  (this->m_signature).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = p__root;
  _read(this);
  return;
}

Assistant:

intel_keym_v1_t::signature_t::signature_t(kaitai::kstream* p__io, intel_keym_v1_t::key_signature_t* p__parent, intel_keym_v1_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    _read();
}